

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall IntrusiveListTest_front_back_Test::TestBody(IntrusiveListTest_front_back_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  const_reference pvVar4;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  TestObjectList *clist;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_88;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  Message local_50;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_front_back_Test *this_local;
  
  list.size_ = (size_t)this;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  gtest_ar.message_.ptr_._4_4_ = 1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,
             (int *)((long)&gtest_ar.message_.ptr_ + 4));
  local_44 = 1;
  pvVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::front
                     ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_40,"1","list.front().data",&local_44,&pvVar2->data);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_74 = 1;
    pvVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::back
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_70,"1","list.back().data",&local_74,&pvVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                 ,0xf1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_2.message_.ptr_._4_4_ = 2;
      wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>
                ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,
                 (int *)((long)&gtest_ar_2.message_.ptr_ + 4));
      local_a4 = 1;
      pvVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::front
                         ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_a0,"1","list.front().data",&local_a4,&pvVar2->data);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0xf4,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_b0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_cc = 2;
        pvVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::back
                           ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_c8,"2","list.back().data",&local_cc,&pvVar2->data);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
        if (!bVar1) {
          testing::Message::Message(&local_d8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&clist,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                     ,0xf5,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&clist,&local_d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&clist);
          testing::Message::~Message(&local_d8);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_4.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
          local_fc = 1;
          pvVar4 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::front
                             ((intrusive_list<(anonymous_namespace)::TestObject> *)
                              gtest_ar_4.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_f8,"1","clist.front().data",&local_fc,&pvVar4->data);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
          if (!bVar1) {
            testing::Message::Message(&local_108);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                       ,0xf8,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_108);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_108);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_124 = 2;
            pvVar4 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::back
                               ((intrusive_list<(anonymous_namespace)::TestObject> *)
                                gtest_ar_4.message_.ptr_);
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_120,"2","clist.back().data",&local_124,&pvVar4->data
                      );
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
            if (!bVar1) {
              testing::Message::Message(&local_130);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
              testing::internal::AssertHelper::AssertHelper
                        (&local_138,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                         ,0xf9,pcVar3);
              testing::internal::AssertHelper::operator=(&local_138,&local_130);
              testing::internal::AssertHelper::~AssertHelper(&local_138);
              testing::Message::~Message(&local_130);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              gtest_ar_1.message_.ptr_._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, front_back) {
  TestObjectList list;

  list.emplace_back(1);
  ASSERT_EQ(1, list.front().data);
  ASSERT_EQ(1, list.back().data);

  list.emplace_back(2);
  ASSERT_EQ(1, list.front().data);
  ASSERT_EQ(2, list.back().data);

  const TestObjectList& clist = list;
  ASSERT_EQ(1, clist.front().data);
  ASSERT_EQ(2, clist.back().data);
}